

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhostinfo_unix.cpp
# Opt level: O2

QHostInfo __thiscall QHostInfoAgent::fromName(QHostInfoAgent *this,QString *hostName)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QHostAddress address;
  QHostInfo results;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  results.d_ptr = (QHostInfoPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QHostInfo::QHostInfo(&results,-1);
  address.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&address);
  bVar2 = QHostAddress::setAddress(&address,hostName);
  if (bVar2) {
    reverseLookup(this,&address);
  }
  else {
    lookup(this,hostName);
  }
  QHostAddress::~QHostAddress(&address);
  QHostInfo::~QHostInfo(&results);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QHostInfo)(QHostInfoPrivate *)this;
  }
  __stack_chk_fail();
}

Assistant:

QHostInfo QHostInfoAgent::fromName(const QString &hostName)
{
    QHostInfo results;

#if defined(QHOSTINFO_DEBUG)
    qDebug("QHostInfoAgent::fromName(%s) looking up...",
           hostName.toLatin1().constData());
#endif

    maybeRefreshResolver();

    QHostAddress address;
    if (address.setAddress(hostName))
        return reverseLookup(address);

    return lookup(hostName);
}